

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBody
          (SwiftGenerator *this,FieldDef *field,bool is_fixed,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor)

{
  EnumDef *ed;
  bool bVar1;
  char *pcVar2;
  byte local_7c3;
  byte local_7c2;
  byte local_7c1;
  string local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  undefined1 local_680 [8];
  string default_value_1;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  allocator<char> local_5d1;
  undefined1 local_5d0 [8];
  string nullable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator<char> local_569;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  byte local_4e2;
  allocator<char> local_4e1;
  undefined1 local_4e0 [8];
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  byte local_45a;
  allocator<char> local_459;
  undefined1 local_458 [8];
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  byte local_3aa;
  allocator<char> local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  undefined1 local_180 [8];
  string question_mark;
  undefined1 local_158 [6];
  bool optional;
  undefined1 local_138 [8];
  string objtype;
  undefined1 local_110 [8];
  string is_required;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string type;
  undefined1 local_70 [8];
  string field_var;
  string field_field;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *base_constructor_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *buffer_constructor_local;
  bool is_fixed_local;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_var.field_2 + 8),&this->namer_,field);
  IdlNamer::Variable_abi_cxx11_((string *)local_70,&this->namer_,field);
  GenType_abi_cxx11_((string *)local_a0,this,&(field->value).type,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"FIELDVAR",&local_c1);
  CodeWriter::SetValue(&this->code_,&local_c0,(string *)((long)&field_var.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"VALUETYPE",
             (allocator<char> *)(is_required.field_2._M_local_buf + 0xf));
  CodeWriter::SetValue(&this->code_,&local_e8,(string *)local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(is_required.field_2._M_local_buf + 0xf));
  bVar1 = FieldDef::IsRequired(field);
  pcVar2 = "?";
  if (bVar1) {
    pcVar2 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,pcVar2,(allocator<char> *)(objtype.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(objtype.field_2._M_local_buf + 0xf));
  switch((field->value).type.base_type) {
  case BASE_TYPE_UTYPE:
    break;
  default:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&nullable.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   " = _t.");
    std::operator+(&local_590,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&nullable.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_var.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(buffer_constructor,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)(nullable.field_2._M_local_buf + 8));
    bVar1 = FieldDef::IsOptional(field);
    pcVar2 = "";
    if (bVar1) {
      pcVar2 = "?";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5d0,pcVar2,&local_5d1);
    std::allocator<char>::~allocator(&local_5d1);
    bVar1 = IsScalar((field->value).type.base_type);
    if (((!bVar1) || (bVar1 = IsBool((field->value).type.base_type), bVar1)) ||
       (bVar1 = IsEnum(&(field->value).type), bVar1)) {
      bVar1 = IsEnum(&(field->value).type);
      if (bVar1) {
        bVar1 = IsEnum(&(field->value).type);
        if (bVar1) {
          GenEnumDefaultValue_abi_cxx11_((string *)local_680,this,field);
        }
        else {
          SwiftConstant_abi_cxx11_((string *)local_680,this,field);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",&local_6a1
                  );
        CodeWriter::operator+=(&this->code_,&local_6a0);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        std::operator+(&local_6e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ," = ");
        std::operator+(&local_6c8,&local_6e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_680);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(base_constructor,&local_6c8);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_6e8);
        default_value_1.field_2._12_4_ = 2;
        std::__cxx11::string::~string((string *)local_680);
      }
      else {
        bVar1 = IsBool((field->value).type.base_type);
        if (bVar1) {
          std::operator+(&local_708,"{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5d0);
          CodeWriter::operator+=(&this->code_,&local_708);
          std::__cxx11::string::~string((string *)&local_708);
          bVar1 = FieldDef::IsOptional(field);
          if (!bVar1) {
            std::operator+(&local_748,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70," = ");
            SwiftConstant_abi_cxx11_(&local_768,this,field);
            std::operator+(&local_728,&local_748,&local_768);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(base_constructor,&local_728);
            std::__cxx11::string::~string((string *)&local_728);
            std::__cxx11::string::~string((string *)&local_768);
            std::__cxx11::string::~string((string *)&local_748);
          }
        }
        default_value_1.field_2._12_4_ = 0;
      }
    }
    else {
      std::operator+(&local_5f8,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0)
      ;
      CodeWriter::operator+=(&this->code_,&local_5f8);
      std::__cxx11::string::~string((string *)&local_5f8);
      bVar1 = FieldDef::IsOptional(field);
      if (!bVar1) {
        std::operator+(&local_638,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ," = ");
        SwiftConstant_abi_cxx11_(&local_658,this,field);
        std::operator+(&local_618,&local_638,&local_658);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(base_constructor,&local_618);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_638);
      }
      default_value_1.field_2._12_4_ = 2;
    }
    std::__cxx11::string::~string((string *)local_5d0);
    break;
  case BASE_TYPE_STRING:
    std::operator+(&local_3f8,"{{ACCESS_TYPE}} var {{FIELDVAR}}: String",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    CodeWriter::operator+=(&this->code_,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&default_value.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   " = _t.");
    std::operator+(&local_418,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&default_value.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_var.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(buffer_constructor,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)(default_value.field_2._M_local_buf + 8));
    bVar1 = FieldDef::IsRequired(field);
    if (bVar1) {
      bVar1 = FieldDef::IsDefault(field);
      local_45a = 0;
      if (bVar1) {
        SwiftConstant_abi_cxx11_((string *)local_458,this,field);
      }
      else {
        std::allocator<char>::allocator();
        local_45a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_458,"",&local_459);
      }
      if ((local_45a & 1) != 0) {
        std::allocator<char>::~allocator(&local_459);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&value.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     " = \"");
      std::operator+(&local_4a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&value.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458)
      ;
      std::operator+(&local_480,&local_4a0,"\"");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(base_constructor,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_458);
    }
    else {
      bVar1 = FieldDef::IsDefault(field);
      if ((bVar1) && (bVar1 = FieldDef::IsRequired(field), !bVar1)) {
        bVar1 = FieldDef::IsDefault(field);
        local_4e2 = 0;
        if (bVar1) {
          SwiftConstant_abi_cxx11_((string *)local_4e0,this,field);
        }
        else {
          std::allocator<char>::allocator();
          local_4e2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_4e0,"nil",&local_4e1);
        }
        if ((local_4e2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_4e1);
        }
        std::operator+(&local_548,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ," = \"");
        std::operator+(&local_528,&local_548,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4e0);
        std::operator+(&local_508,&local_528,"\"");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(base_constructor,&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)local_4e0);
      }
    }
    break;
  case BASE_TYPE_STRUCT:
    GenType_abi_cxx11_((string *)local_138,this,&(field->value).type,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"VALUETYPE",
               (allocator<char> *)(question_mark.field_2._M_local_buf + 0xf));
    CodeWriter::SetValue(&this->code_,(string *)local_158,(string *)local_138);
    std::__cxx11::string::~string((string *)local_158);
    std::allocator<char>::~allocator((allocator<char> *)(question_mark.field_2._M_local_buf + 0xf));
    local_7c1 = 0;
    if ((field->value).type.struct_def != (StructDef *)0x0) {
      local_7c1 = ((field->value).type.struct_def)->fixed;
    }
    question_mark.field_2._M_local_buf[0xe] = local_7c1 & 1;
    bVar1 = FieldDef::IsRequired(field);
    local_7c2 = 1;
    if (!bVar1) {
      local_7c3 = 0;
      if ((question_mark.field_2._M_local_buf[0xe] & 1U) != 0) {
        local_7c3 = is_fixed;
      }
      local_7c2 = local_7c3;
    }
    pcVar2 = "?";
    if ((local_7c2 & 1) != 0) {
      pcVar2 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_180,pcVar2,&local_181);
    std::allocator<char>::~allocator(&local_181);
    std::operator+(&local_1a8,"{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    CodeWriter::operator+=(&this->code_,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::operator+(&local_228,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(&local_208,&local_228," = ");
    std::operator+(&local_1e8,&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    std::operator+(&local_1c8,&local_1e8,"()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(base_constructor,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    if ((((field->value).type.struct_def)->fixed & 1U) == 0) {
      std::operator+(&local_2e8,"var __",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_2c8,&local_2e8," = _t.");
      std::operator+(&local_2a8,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_var.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::operator+(&local_388,"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_368,&local_388," = __");
      std::operator+(&local_348,&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      bVar1 = FieldDef::IsRequired(field);
      local_3aa = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_3aa = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"!",&local_3a9);
      }
      else {
        std::__cxx11::string::string((string *)&local_3a8,(string *)local_180);
      }
      std::operator+(&local_328,&local_348,&local_3a8);
      std::operator+(&local_308,&local_328,".unpack()");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_3a8);
      if ((local_3aa & 1) != 0) {
        std::allocator<char>::~allocator(&local_3a9);
      }
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
    }
    else {
      std::operator+(&local_288,"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_268,&local_288," = _t.");
      std::operator+(&local_248,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_var.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
    }
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_138);
    break;
  case BASE_TYPE_UNION:
    ed = (field->value).type.enum_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"",&local_569);
    BuildUnionEnumSwitchCase(this,ed,(string *)local_70,buffer_constructor,&local_568,false);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    break;
  case BASE_TYPE_ARRAY:
  case BASE_TYPE_VECTOR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"    ",&local_3d1);
    BuildObjectAPIConstructorBodyVectors(this,field,buffer_constructor,base_constructor,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(field_var.field_2._M_local_buf + 8));
  return;
}

Assistant:

void BuildObjectAPIConstructorBody(
      const FieldDef &field, bool is_fixed,
      std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor) {
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", field_field);
    code_.SetValue("VALUETYPE", type);
    std::string is_required = field.IsRequired() ? "" : "?";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        const auto objtype = GenType(field.value.type, true);
        code_.SetValue("VALUETYPE", objtype);
        const auto optional =
            (field.value.type.struct_def && field.value.type.struct_def->fixed);
        std::string question_mark =
            (field.IsRequired() || (optional && is_fixed) ? "" : "?");

        code_ +=
            "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + question_mark;
        base_constructor.push_back("" + field_var + " = " + objtype + "()");

        if (field.value.type.struct_def->fixed) {
          buffer_constructor.push_back("" + field_var + " = _t." + field_field);
        } else {
          buffer_constructor.push_back("var __" + field_var + " = _t." +
                                       field_field);
          buffer_constructor.push_back(
              "" + field_var + " = __" + field_var +
              (field.IsRequired() ? "!" : question_mark) + ".unpack()");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        BuildObjectAPIConstructorBodyVectors(field, buffer_constructor,
                                             base_constructor, "    ");
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: String" + is_required;
        buffer_constructor.push_back(field_var + " = _t." + field_field);

        if (field.IsRequired()) {
          std::string default_value =
              field.IsDefault() ? SwiftConstant(field) : "";
          base_constructor.push_back(field_var + " = \"" + default_value +
                                     "\"");
          break;
        }
        if (field.IsDefault() && !field.IsRequired()) {
          std::string value = field.IsDefault() ? SwiftConstant(field) : "nil";
          base_constructor.push_back(field_var + " = \"" + value + "\"");
        }
        break;
      }
      case BASE_TYPE_UTYPE: break;
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor);
        break;
      }
      default: {
        buffer_constructor.push_back(field_var + " = _t." + field_field);
        std::string nullable = field.IsOptional() ? "?" : "";
        if (IsScalar(field.value.type.base_type) &&
            !IsBool(field.value.type.base_type) && !IsEnum(field.value.type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
          break;
        }

        if (IsEnum(field.value.type)) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: {{VALUETYPE}}";
          base_constructor.push_back(field_var + " = " + default_value);
          break;
        }

        if (IsBool(field.value.type.base_type)) {
          code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: Bool" + nullable;
          if (!field.IsOptional())
            base_constructor.push_back(field_var + " = " +
                                       SwiftConstant(field));
        }
      }
    }
  }